

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::~QMdiSubWindow(QMdiSubWindow *this)

{
  ControlContainer *pCVar1;
  undefined8 *in_RDI;
  QMdiSubWindowPrivate *unaff_retaddr;
  QMdiSubWindowPrivate *d;
  bool in_stack_0000004e;
  bool in_stack_0000004f;
  QMdiSubWindowPrivate *in_stack_00000050;
  QWidget *in_stack_00000068;
  
  *in_RDI = &PTR_metaObject_00d17358;
  in_RDI[2] = &PTR__QMdiSubWindow_00d17508;
  d_func((QMdiSubWindow *)0x63303b);
  QMdiSubWindowPrivate::removeButtonsFromMenuBar(unaff_retaddr);
  QMdiSubWindowPrivate::setActive(in_stack_00000050,in_stack_0000004f,in_stack_0000004e);
  pCVar1 = ::QPointer::operator_cast_to_ControlContainer_
                     ((QPointer<QMdi::ControlContainer> *)0x63306c);
  if (pCVar1 != (ControlContainer *)0x0) {
    (**(code **)(*(long *)pCVar1 + 0x20))();
  }
  QWidget::~QWidget(in_stack_00000068);
  return;
}

Assistant:

QMdiSubWindow::~QMdiSubWindow()
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    delete d->controlContainer;
}